

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O2

void GraphBase::format_graph(string *filename,string *mode)

{
  pointer ppVar1;
  char cVar2;
  int iVar3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  ostream *poVar4;
  istream *piVar5;
  pair<unsigned_int,_float> *nbr;
  pointer ppVar6;
  uint uVar7;
  long lVar8;
  int idx;
  ulong uVar9;
  long lVar10;
  size_t j;
  long lVar11;
  bool bVar12;
  float weight;
  size_t numV;
  pair<unsigned_int,_float> local_348;
  uint32_t dstId;
  uint32_t srcId;
  Graph vecGRev;
  Graph vecG;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecInDeg;
  size_t numE;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecOutDeg;
  string local_2b8;
  string local_298;
  string local_278 [32];
  string local_258 [32];
  ifstream infile;
  
  iVar3 = tolower((int)*(mode->_M_dataplus)._M_p);
  uVar7 = iVar3 << 0x18;
  if ((uVar7 | 0x10000000) != 0x77000000) {
    std::__cxx11::string::string(local_258,"The input mode is not supported:",(allocator *)&infile);
    std::__cxx11::string::string(local_278,(string *)mode);
    poVar4 = std::operator<<((ostream *)&std::cout,local_258);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,local_278);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_258);
    LogInfo<char_const*>("The supported modes: -mode=g or -mode=w");
    LogInfo<char_const*>("g: graph only (default, using WC), w: with edge property");
  }
  std::ifstream::ifstream(&infile,(string *)filename,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vecGRev,
                   "The file \"",filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vecG,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vecGRev,
                   "\" can NOT be opened\n");
    std::operator<<((ostream *)&std::cout,(string *)&vecG);
    std::__cxx11::string::~string((string *)&vecG);
    std::__cxx11::string::~string((string *)&vecGRev);
  }
  else {
    piVar5 = std::istream::_M_extract<unsigned_long>((ulong *)&infile);
    std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&vecG,numV,(allocator_type *)&vecGRev);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&vecGRev,numV,(allocator_type *)&vecOutDeg);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&vecOutDeg,numV,(allocator_type *)&vecInDeg);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&vecInDeg,numV,(allocator_type *)&local_348);
    while (bVar12 = numE != 0, numE = numE - 1, bVar12) {
      if (uVar7 == 0x77000000) {
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)&infile);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
        std::istream::_M_extract<float>((float *)piVar5);
      }
      else {
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)&infile);
        std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      }
      local_348.first = dstId;
      local_348.second = 0.0;
      std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
      emplace_back<std::pair<unsigned_int,float>>
                ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)(vecG.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + srcId),&local_348);
      local_348.first = srcId;
      local_348.second = 0.0;
      std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
      emplace_back<std::pair<unsigned_int,float>>
                ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)(vecGRev.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + dstId),&local_348);
    }
    std::ifstream::close();
    lVar8 = 1;
    for (uVar9 = 0; uVar9 < numV; uVar9 = uVar9 + 1) {
      vecOutDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] =
           (long)(&((vecG.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)[lVar8] -
           *(long *)((long)vecG.
                           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + -8) >> 3;
      vecInDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] =
           (long)(&((vecGRev.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)[lVar8] -
           *(long *)((long)vecGRev.
                           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + -8) >> 3;
      lVar8 = lVar8 + 3;
    }
    if (uVar7 == 0x67000000) {
      for (; vecG.
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             vecG.
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          vecG.
          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               vecG.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        ppVar1 = ((vecG.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar6 = ((vecG.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1;
            ppVar6 = ppVar6 + 1) {
          ppVar6->second =
               1.0 / (float)vecInDeg.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[ppVar6->first];
        }
      }
      for (lVar8 = 0;
          lVar8 != ((long)vecGRev.
                          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vecGRev.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar8 = lVar8 + 1) {
        ppVar6 = vecGRev.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8].
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)vecGRev.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar8].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6;
        if (lVar10 != 0) {
          uVar9 = vecInDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar8];
          for (lVar11 = 0; lVar10 >> 3 != lVar11; lVar11 = lVar11 + 1) {
            ppVar6[lVar11].second = 1.0 / (float)uVar9;
          }
        }
      }
    }
    std::__cxx11::string::string((string *)&local_298,(string *)filename);
    IOcontroller::save_graph_struct(&local_298,&vecG,false);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_2b8,(string *)filename);
    IOcontroller::save_graph_struct(&local_2b8,&vecGRev,true);
    std::__cxx11::string::~string((string *)&local_2b8);
    poVar4 = std::operator<<((ostream *)&std::cout,"The graph is formatted!");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&vecInDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&vecOutDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&vecGRev);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&vecG);
  }
  std::ifstream::~ifstream(&infile);
  return;
}

Assistant:

static void format_graph(const std::string filename, const std::string mode)
    {
        const char m1 = tolower(mode[0]);
        const bool cond = m1 == 'g' || m1 == 'w';
        if (!cond)
        {
            LogInfo("The input mode is not supported:", mode);
            LogInfo("The supported modes: -mode=g or -mode=w");
            LogInfo("g: graph only (default, using WC), w: with edge property");
        }

        size_t numV, numE;
        uint32_t srcId, dstId;
        float weight = 0.0;
        std::ifstream infile(filename);
        if (!infile.is_open())
        {
            std::cout << "The file \"" + filename + "\" can NOT be opened\n";
            return;
        }
        infile >> numV >> numE;

        // FILE* fin;
        // const errno_t err = fopen_s(&fin, filename.c_str(), "r");
        // if (err != 0)
        // {
        // 	std::cout << "The file \"" + filename + "\" can NOT be opened\n";
        // 	return;
        // }
        // fscanf_s(fin, "%zu%zu", &numV, &numE);

        Graph vecG(numV);
        Graph vecGRev(numV);
        std::vector<size_t> vecOutDeg(numV);
        std::vector<size_t> vecInDeg(numV);
        for (auto i = numE; i--;)
        {
            if (m1 == 'w')
            {
                infile >> srcId >> dstId >> weight;
                // fscanf_s(fin, "%u%u%f", &srcId, &dstId, &weight);
            }
            else
            {
                infile >> srcId >> dstId;
                // fscanf_s(fin, "%u%u", &srcId, &dstId);
            }
            vecG[srcId].push_back(Edge(dstId, weight));
            vecGRev[dstId].push_back(Edge(srcId, weight));
        }
        infile.close();
        for (auto idx = 0; idx < numV; idx++)
        {
            vecOutDeg[idx] = vecG[idx].size();
            vecInDeg[idx] = vecGRev[idx].size();
        }
        if (m1 == 'g')
        {
            // When the input is a graph only, set the diffusion probability using WC setting
            for (auto& nbrs : vecG) {
                for (auto& nbr : nbrs) {
                    nbr.second = (float) 1.0 / vecInDeg[nbr.first];
                }
            }

            for (size_t i = 0; i < vecGRev.size(); i++){
                if (vecGRev[i].size() == 0) {
                    continue;
                }
                weight = (float) 1.0 / vecInDeg[i];
                for (size_t j = 0; j < vecGRev[i].size(); j++) {
                    vecGRev[i][j].second = weight;
                }
            }
            // The bug is found by sibo
            // auto idx = 0;
            // for (auto& inNbrs : vecGRev)
            // {
            //    if (inNbrs.empty()) continue; // Skip if there is no in-neighbor.
            //    weight = (float)1.0 / vecInDeg[idx++];
            //    for (auto& inNbr : inNbrs)
            //    {
            //        inNbr.second = weight;
            //    }
            // }
        }
        TIO::save_graph_struct(filename, vecG, false);
        TIO::save_graph_struct(filename, vecGRev, true);
        std::cout << "The graph is formatted!" << std::endl;
    }